

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FeatureTypes.pb.cc
# Opt level: O1

void __thiscall
CoreML::Specification::FeatureType::SerializeWithCachedSizes
          (FeatureType *this,CodedOutputStream *output)

{
  if (this->_oneof_case_[0] == 1) {
    google::protobuf::internal::WireFormatLite::WriteMessage
              (1,&((this->Type_).int64type_)->super_MessageLite,output);
  }
  if (this->_oneof_case_[0] == 2) {
    google::protobuf::internal::WireFormatLite::WriteMessage
              (2,&((this->Type_).int64type_)->super_MessageLite,output);
  }
  if (this->_oneof_case_[0] == 3) {
    google::protobuf::internal::WireFormatLite::WriteMessage
              (3,&((this->Type_).int64type_)->super_MessageLite,output);
  }
  if (this->_oneof_case_[0] == 4) {
    google::protobuf::internal::WireFormatLite::WriteMessage
              (4,&((this->Type_).int64type_)->super_MessageLite,output);
  }
  if (this->_oneof_case_[0] == 5) {
    google::protobuf::internal::WireFormatLite::WriteMessage
              (5,&((this->Type_).int64type_)->super_MessageLite,output);
  }
  if (this->_oneof_case_[0] == 6) {
    google::protobuf::internal::WireFormatLite::WriteMessage
              (6,&((this->Type_).int64type_)->super_MessageLite,output);
  }
  if (this->_oneof_case_[0] == 7) {
    google::protobuf::internal::WireFormatLite::WriteMessage
              (7,&((this->Type_).int64type_)->super_MessageLite,output);
  }
  if (this->isoptional_ == true) {
    google::protobuf::internal::WireFormatLite::WriteBool(1000,true,output);
    return;
  }
  return;
}

Assistant:

void FeatureType::SerializeWithCachedSizes(
    ::google::protobuf::io::CodedOutputStream* output) const {
  // @@protoc_insertion_point(serialize_start:CoreML.Specification.FeatureType)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  // .CoreML.Specification.Int64FeatureType int64Type = 1;
  if (has_int64type()) {
    ::google::protobuf::internal::WireFormatLite::WriteMessage(
      1, *Type_.int64type_, output);
  }

  // .CoreML.Specification.DoubleFeatureType doubleType = 2;
  if (has_doubletype()) {
    ::google::protobuf::internal::WireFormatLite::WriteMessage(
      2, *Type_.doubletype_, output);
  }

  // .CoreML.Specification.StringFeatureType stringType = 3;
  if (has_stringtype()) {
    ::google::protobuf::internal::WireFormatLite::WriteMessage(
      3, *Type_.stringtype_, output);
  }

  // .CoreML.Specification.ImageFeatureType imageType = 4;
  if (has_imagetype()) {
    ::google::protobuf::internal::WireFormatLite::WriteMessage(
      4, *Type_.imagetype_, output);
  }

  // .CoreML.Specification.ArrayFeatureType multiArrayType = 5;
  if (has_multiarraytype()) {
    ::google::protobuf::internal::WireFormatLite::WriteMessage(
      5, *Type_.multiarraytype_, output);
  }

  // .CoreML.Specification.DictionaryFeatureType dictionaryType = 6;
  if (has_dictionarytype()) {
    ::google::protobuf::internal::WireFormatLite::WriteMessage(
      6, *Type_.dictionarytype_, output);
  }

  // .CoreML.Specification.SequenceFeatureType sequenceType = 7;
  if (has_sequencetype()) {
    ::google::protobuf::internal::WireFormatLite::WriteMessage(
      7, *Type_.sequencetype_, output);
  }

  // bool isOptional = 1000;
  if (this->isoptional() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteBool(1000, this->isoptional(), output);
  }

  // @@protoc_insertion_point(serialize_end:CoreML.Specification.FeatureType)
}